

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_conf_own_cert
              (mbedtls_ssl_config *conf,mbedtls_x509_crt *own_cert,
              mbedtls_pk_context_conflict *pk_key)

{
  int iVar1;
  mbedtls_pk_context_conflict *pk_key_local;
  mbedtls_x509_crt *own_cert_local;
  mbedtls_ssl_config *conf_local;
  
  iVar1 = ssl_append_key_cert(&conf->key_cert,own_cert,pk_key);
  return iVar1;
}

Assistant:

int mbedtls_ssl_conf_own_cert(mbedtls_ssl_config *conf,
                              mbedtls_x509_crt *own_cert,
                              mbedtls_pk_context *pk_key)
{
    return ssl_append_key_cert(&conf->key_cert, own_cert, pk_key);
}